

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AgenPeeps.cpp
# Opt level: O2

bool __thiscall AgenPeeps::AlwaysDependent(AgenPeeps *this,Instr *instr)

{
  OpCode OVar1;
  bool bVar2;
  bool bVar3;
  
  bVar2 = LowererMD::IsCall(instr);
  bVar3 = true;
  if (!bVar2) {
    OVar1 = instr->m_opcode;
    if ((((6 < OVar1 - 0x413) || ((0x61U >> (OVar1 - 0x413 & 0x1f) & 1) == 0)) && (OVar1 != POP)) &&
       (OVar1 != PUSH)) {
      bVar3 = false;
    }
  }
  return bVar3;
}

Assistant:

bool AgenPeeps::AlwaysDependent(IR::Instr *instr)
{
    return LowererMD::IsCall(instr) ||
        instr->m_opcode == Js::OpCode::PUSH ||
        instr->m_opcode == Js::OpCode::POP ||
        instr->m_opcode == Js::OpCode::DIV ||
        instr->m_opcode == Js::OpCode::IDIV ||
        instr->m_opcode == Js::OpCode::IMUL;
}